

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::updateRedundantRows
          (HighsDomain *this,HighsInt row,HighsInt direction,HighsInt numinf,HighsCDouble activity,
          double bound)

{
  HighsCDouble HVar1;
  HighsInt local_2c;
  double local_28;
  double local_20;
  HighsCDouble local_18;
  
  local_18.lo = activity.lo;
  local_18.hi = activity.hi;
  if (numinf == 0) {
    local_20 = (double)direction;
    local_2c = row;
    local_28 = bound;
    HVar1 = HighsCDouble::operator*(&local_18,local_20);
    if (local_28 * local_20 +
        ((this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol <
        HVar1.lo + HVar1.hi) {
      HighsHashTable<int,void>::insert<int&>
                ((HighsHashTable<int,void> *)&this->redundantRows_,&local_2c);
    }
  }
  return;
}

Assistant:

void HighsDomain::updateRedundantRows(HighsInt row, HighsInt direction,
                                      HighsInt numinf, HighsCDouble activity,
                                      double bound) {
  if (numinf != 0 || direction * activity <=
                         direction * bound + mipsolver->mipdata_->feastol) {
    // row that was found to be redundant should not be non-redundant
    assert(redundantRows_.find(row) == nullptr);
    return;
  }
  // row is redundant
  redundantRows_.insert(row);
}